

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_Level.cpp
# Opt level: O1

void __thiscall amrex::EB2::Level::fillBndryNorm(Level *this,MultiFab *bndrynorm,Geometry *geom)

{
  int iVar1;
  int ncomp;
  Periodicity local_58;
  IntVect local_48;
  IntVect local_3c;
  
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&bndrynorm->super_FabArray<amrex::FArrayBox>,0.0,0,
             (bndrynorm->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
             &(bndrynorm->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow);
  if (this->m_allregular == false) {
    iVar1 = (bndrynorm->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
    ncomp = (bndrynorm->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
    local_58 = Geometry::periodicity(geom);
    local_3c.vect[0] = 0;
    local_3c.vect[1] = 0;
    local_3c.vect[2] = 0;
    local_48.vect[0] = iVar1;
    local_48.vect[1] = iVar1;
    local_48.vect[2] = iVar1;
    FabArray<amrex::FArrayBox>::ParallelCopy_nowait
              (&bndrynorm->super_FabArray<amrex::FArrayBox>,
               &(this->m_bndrynorm).super_FabArray<amrex::FArrayBox>,0,0,ncomp,&local_3c,&local_48,
               &local_58,COPY,(CPC *)0x0,false);
  }
  return;
}

Assistant:

void
Level::fillBndryNorm (   MultiFab& bndrynorm, const Geometry& geom) const
{
    bndrynorm.setVal(0.0);
    if (!isAllRegular()) {
        bndrynorm.ParallelCopy(m_bndrynorm,0,0,bndrynorm.nComp(),0,bndrynorm.nGrow(),
                               geom.periodicity());
    }
}